

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

int __thiscall QCompletionModel::rowCount(QCompletionModel *this,QModelIndex *parent)

{
  long lVar1;
  QCompletionEngine *this_00;
  long *plVar2;
  bool bVar3;
  int iVar4;
  
  lVar1 = *(long *)&this->field_0x8;
  bVar3 = QModelIndex::isValid(parent);
  if (bVar3) {
    return 0;
  }
  if (this->showAll == true) {
    this_00 = (this->engine).d;
    if ((((this_00->curParts).d.size != 1) &&
        (iVar4 = QCompletionEngine::matchCount(this_00), iVar4 == 0)) &&
       (bVar3 = QModelIndex::isValid(&((this->engine).d)->curParent), !bVar3)) {
      return 0;
    }
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(lVar1 + 0xd8));
    plVar2 = *(long **)(lVar1 + 0xd8);
    iVar4 = (**(code **)(*plVar2 + 0x78))(plVar2,&((this->engine).d)->curParent);
    return iVar4;
  }
  iVar4 = completionCount(this);
  return iVar4;
}

Assistant:

int QCompletionModel::rowCount(const QModelIndex &parent) const
{
    Q_D(const QCompletionModel);
    if (parent.isValid())
        return 0;

    if (showAll) {
        // Show all items below current parent, even if we have no valid matches
        if (engine->curParts.size() != 1  && !engine->matchCount()
            && !engine->curParent.isValid())
            return 0;
        return d->model->rowCount(engine->curParent);
    }

    return completionCount();
}